

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.h
# Opt level: O0

Gauge * __thiscall
prometheus::Family<prometheus::Gauge>::Add<>(Family<prometheus::Gauge> *this,Labels *labels)

{
  Gauge *pGVar1;
  unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_> local_20;
  Labels *local_18;
  Labels *labels_local;
  Family<prometheus::Gauge> *this_local;
  
  local_18 = labels;
  labels_local = (Labels *)this;
  detail::make_unique<prometheus::Gauge>();
  pGVar1 = Add(this,labels,&local_20);
  std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>::~unique_ptr
            (&local_20);
  return pGVar1;
}

Assistant:

T& Add(const Labels& labels, Args&&... args) {
    return Add(labels, detail::make_unique<T>(args...));
  }